

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::absI8x16(Literal *__return_storage_ptr__,Literal *this)

{
  Type *this_00;
  Literal *in_RDX;
  long lVar1;
  Literal *this_01;
  undefined1 local_1c0 [8];
  LaneArray<16> lanes;
  
  getLanes<signed_char,16>((LaneArray<16> *)local_1c0,(wasm *)this,in_RDX);
  this_00 = &lanes._M_elems[0xf].type;
  for (lVar1 = 0; lVar1 != 0x180; lVar1 = lVar1 + 0x18) {
    this_01 = (Literal *)(local_1c0 + lVar1);
    abs((Literal *)this_00,(int)this_01);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
  }
  Literal(__return_storage_ptr__,(LaneArray<16> *)local_1c0);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_1c0);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::absI8x16() const {
  return unary<16, &Literal::getLanesSI8x16, &Literal::abs>(*this);
}